

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# biginteger.h
# Opt level: O2

BigInteger * __thiscall rapidjson::internal::BigInteger::operator<<=(BigInteger *this,size_t shift)

{
  byte bVar1;
  size_t sVar2;
  BigInteger *pBVar3;
  RapidJSONException *this_00;
  long lVar4;
  ulong uVar5;
  
  sVar2 = this->count_;
  if ((shift == 0) || (sVar2 == 1 && this->digits_[0] == 0)) {
    return this;
  }
  uVar5 = shift >> 6;
  if (0x1a0 < sVar2 + uVar5) {
    this_00 = (RapidJSONException *)__cxa_allocate_exception(0x10);
    cereal::RapidJSONException::RapidJSONException
              (this_00,"rapidjson internal assertion failure: count_ + offset <= kCapacity");
    __cxa_throw(this_00,&cereal::RapidJSONException::typeinfo,std::runtime_error::~runtime_error);
  }
  if ((shift & 0x3f) == 0) {
    memmove(this->digits_ + uVar5,this,sVar2 << 3);
    sVar2 = this->count_ + uVar5;
  }
  else {
    this->digits_[sVar2] = 0;
    sVar2 = this->count_;
    for (lVar4 = 0; -lVar4 != sVar2; lVar4 = lVar4 + -1) {
      bVar1 = (byte)shift & 0x3f;
      this->digits_[sVar2 + uVar5 + lVar4] =
           this->digits_[sVar2 + lVar4] << bVar1 | this->digits_[sVar2 + lVar4 + -1] >> 0x40 - bVar1
      ;
    }
    this->digits_[uVar5] = this->digits_[0] << ((byte)shift & 0x3f);
    sVar2 = this->count_ + uVar5;
    this->count_ = sVar2;
    if (this->digits_[sVar2] == 0) goto LAB_001451ef;
    sVar2 = sVar2 + 1;
  }
  this->count_ = sVar2;
LAB_001451ef:
  pBVar3 = (BigInteger *)memset(this,0,uVar5 << 3);
  return pBVar3;
}

Assistant:

BigInteger& operator<<=(size_t shift) {
        if (IsZero() || shift == 0) return *this;

        size_t offset = shift / kTypeBit;
        size_t interShift = shift % kTypeBit;
        CEREAL_RAPIDJSON_ASSERT(count_ + offset <= kCapacity);

        if (interShift == 0) {
            std::memmove(digits_ + offset, digits_, count_ * sizeof(Type));
            count_ += offset;
        }
        else {
            digits_[count_] = 0;
            for (size_t i = count_; i > 0; i--)
                digits_[i + offset] = (digits_[i] << interShift) | (digits_[i - 1] >> (kTypeBit - interShift));
            digits_[offset] = digits_[0] << interShift;
            count_ += offset;
            if (digits_[count_])
                count_++;
        }

        std::memset(digits_, 0, offset * sizeof(Type));

        return *this;
    }